

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O1

Statement *
slang::ast::BlockStatement::fromSyntax
          (Compilation *comp,BlockStatementSyntax *syntax,ASTContext *sourceCtx,
          StatementContext *stmtCtx,bool addInitializers)

{
  uint uVar1;
  size_type sVar2;
  pointer ppSVar3;
  SyntaxNode *this;
  bool bVar4;
  bool bVar5;
  StatementBlockKind SVar6;
  int iVar7;
  ProceduralBlockSymbol *pPVar8;
  Diagnostic *this_00;
  InvalidStatement *pIVar9;
  StatementSyntax *pSVar10;
  undefined4 extraout_var;
  BlockStatement *pBVar11;
  long lVar12;
  SourceRange SVar13;
  string_view arg;
  ASTContext context;
  SmallVector<const_slang::ast::Statement_*,_5UL> buffer;
  BlockStatement *local_c8;
  BlockStatementSyntax *local_c0;
  Compilation *local_b8;
  ulong local_b0;
  ASTContext local_a8;
  undefined1 local_70 [64];
  
  local_a8.assertionInstance = sourceCtx->assertionInstance;
  local_a8.scope.ptr = (sourceCtx->scope).ptr;
  local_a8.lookupIndex = sourceCtx->lookupIndex;
  local_a8._12_4_ = *(undefined4 *)&sourceCtx->field_0xc;
  local_a8.flags.m_bits = (sourceCtx->flags).m_bits;
  local_a8.instanceOrProc = sourceCtx->instanceOrProc;
  local_a8.firstTempVar = sourceCtx->firstTempVar;
  local_a8.randomizeDetails = sourceCtx->randomizeDetails;
  SVar6 = SemanticFacts::getStatementBlockKind(syntax);
  local_b0 = (ulong)SVar6;
  if ((local_a8.flags.m_bits & 0x6000) == 0) {
    if ((SVar6 != Sequential) && (bVar4 = ASTContext::inAlwaysCombLatch(&local_a8), bVar4)) {
      pPVar8 = ASTContext::getProceduralBlock(&local_a8);
      if (pPVar8 == (ProceduralBlockSymbol *)0x0) {
        assert::assertFailed
                  ("proc",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Statements.cpp"
                   ,0x29d,
                   "static Statement &slang::ast::BlockStatement::fromSyntax(Compilation &, const BlockStatementSyntax &, const ASTContext &, StatementContext &, bool)"
                  );
      }
      SVar13 = parsing::Token::range(&syntax->begin);
      this_00 = ASTContext::addDiag(&local_a8,(DiagCode)0x170008,SVar13);
      arg = SemanticFacts::getProcedureKindStr(pPVar8->procedureKind);
      Diagnostic::operator<<(this_00,arg);
      goto LAB_0027a8ce;
    }
  }
  else {
    if (SVar6 - JoinAll < 2) {
      SVar13 = parsing::Token::range(&syntax->end);
      ASTContext::addDiag(&local_a8,(DiagCode)0x460008,SVar13);
LAB_0027a8ce:
      local_70._0_8_ = (Statement *)0x0;
      pIVar9 = BumpAllocator::emplace<slang::ast::InvalidStatement,slang::ast::Statement_const*&>
                         (&comp->super_BumpAllocator,(Statement **)local_70);
      return &pIVar9->super_Statement;
    }
    if (SVar6 == JoinNone) {
      local_a8.flags.m_bits = local_a8.flags.m_bits & 0xfffff9fff;
    }
  }
  uVar1 = (stmtCtx->flags).m_bits;
  if (SVar6 != Sequential) {
    (stmtCtx->flags).m_bits = uVar1 | 2;
  }
  local_70._0_8_ = local_70 + 0x18;
  local_70._8_8_ = 0;
  local_70._16_8_ = 5;
  if (addInitializers) {
    Statement::bindScopeInitializers
              (&local_a8,(SmallVectorBase<const_slang::ast::Statement_*> *)local_70);
  }
  sVar2 = (syntax->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>.size_;
  if (sVar2 == 0) {
    bVar4 = false;
  }
  else {
    ppSVar3 = (syntax->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>.data_;
    lVar12 = 0;
    bVar4 = false;
    local_c0 = syntax;
    local_b8 = comp;
    do {
      this = *(SyntaxNode **)((long)ppSVar3 + lVar12);
      bVar5 = slang::syntax::StatementSyntax::isKind(this->kind);
      if (bVar5) {
        pSVar10 = slang::syntax::SyntaxNode::as<slang::syntax::StatementSyntax>(this);
        iVar7 = Statement::bind((int)pSVar10,(sockaddr *)&local_a8,(socklen_t)stmtCtx);
        local_c8 = (BlockStatement *)CONCAT44(extraout_var,iVar7);
        SmallVectorBase<slang::ast::Statement_const*>::emplace_back<slang::ast::Statement_const*>
                  ((SmallVectorBase<slang::ast::Statement_const*> *)local_70,(Statement **)&local_c8
                  );
        bVar4 = (bool)(bVar4 | (((BlockStatement *)CONCAT44(extraout_var,iVar7))->super_Statement).
                               kind == Invalid);
      }
      lVar12 = lVar12 + 8;
      syntax = local_c0;
      comp = local_b8;
    } while (sVar2 << 3 != lVar12);
  }
  SVar6 = (StatementBlockKind)local_b0;
  pBVar11 = createBlockStatement
                      (comp,(SmallVectorBase<const_slang::ast::Statement_*> *)local_70,
                       (SyntaxNode *)syntax,SVar6);
  if ((char)((uVar1 & 2) >> 1) == '\0' && SVar6 != Sequential) {
    (stmtCtx->flags).m_bits = (stmtCtx->flags).m_bits & 0x1d;
  }
  if (bVar4) {
    local_c8 = pBVar11;
    pBVar11 = (BlockStatement *)
              BumpAllocator::emplace<slang::ast::InvalidStatement,slang::ast::Statement_const*&>
                        (&comp->super_BumpAllocator,(Statement **)&local_c8);
  }
  if ((Statement *)local_70._0_8_ != (Statement *)(local_70 + 0x18)) {
    free((void *)local_70._0_8_);
  }
  return &pBVar11->super_Statement;
}

Assistant:

Statement& BlockStatement::fromSyntax(Compilation& comp, const BlockStatementSyntax& syntax,
                                      const ASTContext& sourceCtx, StatementContext& stmtCtx,
                                      bool addInitializers) {
    ASTContext context = sourceCtx;
    auto blockKind = SemanticFacts::getStatementBlockKind(syntax);
    if (context.flags.has(ASTFlags::Function | ASTFlags::Final)) {
        if (blockKind == StatementBlockKind::JoinAll || blockKind == StatementBlockKind::JoinAny) {
            context.addDiag(diag::TimingInFuncNotAllowed, syntax.end.range());
            return badStmt(comp, nullptr);
        }
        else if (blockKind == StatementBlockKind::JoinNone) {
            // The "function body" flag does not propagate through fork-join_none
            // blocks, as all statements are allowed in those.
            context.flags &= ~ASTFlags::Function & ~ASTFlags::Final;
        }
    }
    else if (blockKind != StatementBlockKind::Sequential && context.inAlwaysCombLatch()) {
        auto proc = context.getProceduralBlock();
        ASSERT(proc);
        context.addDiag(diag::ForkJoinAlwaysComb, syntax.begin.range())
            << SemanticFacts::getProcedureKindStr(proc->procedureKind);
        return badStmt(comp, nullptr);
    }

    bool wasInForkJoin = stmtCtx.flags.has(StatementFlags::InForkJoin);
    if (blockKind != StatementBlockKind::Sequential)
        stmtCtx.flags |= StatementFlags::InForkJoin;

    bool anyBad = false;
    SmallVector<const Statement*> buffer;

    if (addInitializers)
        bindScopeInitializers(context, buffer);

    for (auto item : syntax.items) {
        if (StatementSyntax::isKind(item->kind)) {
            auto& stmt = Statement::bind(item->as<StatementSyntax>(), context, stmtCtx,
                                         /* inList */ true);
            buffer.push_back(&stmt);
            anyBad |= stmt.bad();
        }
    }

    auto result = createBlockStatement(comp, buffer, syntax, blockKind);

    if (blockKind != StatementBlockKind::Sequential && !wasInForkJoin)
        stmtCtx.flags &= ~StatementFlags::InForkJoin;

    if (anyBad)
        return badStmt(comp, result);

    return *result;
}